

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemiterator_unix.cpp
# Opt level: O1

bool __thiscall
QFileSystemIterator::advance
          (QFileSystemIterator *this,QFileSystemEntry *fileEntry,QFileSystemMetaData *metaData)

{
  Interface *pIVar1;
  long lVar2;
  QArrayData *data;
  char *pcVar3;
  qsizetype qVar4;
  QArrayData *pQVar5;
  char16_t *pcVar6;
  bool bVar7;
  int *piVar8;
  dirent64 *pdVar9;
  size_t sVar10;
  QChar *pQVar11;
  long asize;
  qsizetype qVar12;
  long in_FS_OFFSET;
  QByteArrayView QVar13;
  QVarLengthArray<char16_t,_256LL> buffer;
  QStringBuilder<QString_&,_QStringView_&> local_2c0;
  QString local_2b0;
  QStringView local_298;
  QFileSystemEntry local_288;
  QChar local_250 [256];
  QVLABase<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->dir)._M_t.super___uniq_ptr_impl<__dirstream,_QFileSystemIterator::DirStreamCloser>._M_t
      .super__Tuple_impl<0UL,___dirstream_*,_QFileSystemIterator::DirStreamCloser>.
      super__Head_base<0UL,___dirstream_*,_false>._M_head_impl == (__dirstream *)0x0) {
LAB_0012c525:
    bVar7 = false;
  }
  else {
    piVar8 = __errno_location();
    do {
      *piVar8 = 0;
      pdVar9 = readdir64((DIR *)(this->dir)._M_t.
                                super___uniq_ptr_impl<__dirstream,_QFileSystemIterator::DirStreamCloser>
                                ._M_t.
                                super__Tuple_impl<0UL,___dirstream_*,_QFileSystemIterator::DirStreamCloser>
                                .super__Head_base<0UL,___dirstream_*,_false>._M_head_impl);
      this->dirEntry = (dirent64 *)pdVar9;
      if (pdVar9 == (dirent64 *)0x0) {
        this->lastError = *piVar8;
        goto LAB_0012c525;
      }
      sVar10 = strlen(pdVar9->d_name);
      memset(local_250,0xaa,0x218);
      local_50.super_QVLABaseBase.a = 0x100;
      local_50.super_QVLABaseBase.s = 0;
      local_50.super_QVLABaseBase.ptr = local_250;
      if (0x100 < (long)sVar10) {
        advance();
      }
      pIVar1 = (this->toUtf16).super_QStringConverter.iface;
      local_50.super_QVLABaseBase.s = sVar10;
      if (pIVar1 == (Interface *)0x0) {
        (this->toUtf16).super_QStringConverter.state.invalidChars = 1;
        pQVar11 = (QChar *)local_50.super_QVLABaseBase.ptr;
      }
      else {
        QVar13.m_data = pdVar9->d_name;
        QVar13.m_size = sVar10;
        pQVar11 = (*pIVar1->toUtf16)((QChar *)local_50.super_QVLABaseBase.ptr,QVar13,
                                     &(this->toUtf16).super_QStringConverter.state);
      }
      asize = (long)pQVar11 - (long)local_50.super_QVLABaseBase.ptr >> 1;
      qVar12 = local_50.super_QVLABaseBase.a;
      if (local_50.super_QVLABaseBase.a <= asize) {
        qVar12 = asize;
      }
      QVLABase<char16_t>::reallocate_impl(&local_50,0x100,local_250,asize,qVar12);
      lVar2 = (this->toUtf16).super_QStringConverter.state.invalidChars;
      local_50.super_QVLABaseBase.s = asize;
      if (lVar2 == 0) {
        local_298.m_data = (storage_type_conflict *)local_50.super_QVLABaseBase.ptr;
        local_2c0.b = &local_298;
        local_2c0.a = &this->dirPath;
        local_298.m_size = asize;
        QStringBuilder<QString_&,_QStringView_&>::convertTo<QString>(&local_2b0,&local_2c0);
        QFileSystemEntry::QFileSystemEntry(&local_288,&local_2b0);
        if (&(local_2b0.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_2b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_2b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_2b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_2b0.d.d)->super_QArrayData,2,0x10);
          }
        }
        pQVar5 = &((fileEntry->m_filePath).d.d)->super_QArrayData;
        pcVar6 = (fileEntry->m_filePath).d.ptr;
        (fileEntry->m_filePath).d.d = local_288.m_filePath.d.d;
        (fileEntry->m_filePath).d.ptr = local_288.m_filePath.d.ptr;
        qVar12 = (fileEntry->m_filePath).d.size;
        (fileEntry->m_filePath).d.size = local_288.m_filePath.d.size;
        data = &((fileEntry->m_nativeFilePath).d.d)->super_QArrayData;
        pcVar3 = (fileEntry->m_nativeFilePath).d.ptr;
        (fileEntry->m_nativeFilePath).d.d = local_288.m_nativeFilePath.d.d;
        (fileEntry->m_nativeFilePath).d.ptr = local_288.m_nativeFilePath.d.ptr;
        qVar4 = (fileEntry->m_nativeFilePath).d.size;
        (fileEntry->m_nativeFilePath).d.size = local_288.m_nativeFilePath.d.size;
        fileEntry->m_lastDotInFileName = local_288.m_lastDotInFileName;
        fileEntry->m_lastSeparator = local_288.m_lastSeparator;
        fileEntry->m_firstDotInFileName = local_288.m_firstDotInFileName;
        local_288.m_filePath.d.d = (Data *)pQVar5;
        local_288.m_filePath.d.ptr = pcVar6;
        local_288.m_filePath.d.size = qVar12;
        local_288.m_nativeFilePath.d.d = (Data *)data;
        local_288.m_nativeFilePath.d.ptr = pcVar3;
        local_288.m_nativeFilePath.d.size = qVar4;
        if (data != (QArrayData *)0x0) {
          LOCK();
          (data->ref_)._q_value.super___atomic_base<int>._M_i =
               (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(data,1,0x10);
          }
        }
        if (&(local_288.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_288.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
               = ((local_288.m_filePath.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_288.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_288.m_filePath.d.d)->super_QArrayData,2,0x10);
          }
        }
        QFileSystemMetaData::fillFromDirEnt(metaData,this->dirEntry);
      }
      else {
        *piVar8 = 0x54;
      }
      if ((QChar *)local_50.super_QVLABaseBase.ptr != local_250) {
        QtPrivate::sizedFree(local_50.super_QVLABaseBase.ptr,local_50.super_QVLABaseBase.a * 2);
      }
    } while (lVar2 != 0);
    bVar7 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemIterator::advance(QFileSystemEntry &fileEntry, QFileSystemMetaData &metaData)
{
    auto asFileEntry = [this](QStringView name) {
#ifdef Q_OS_DARWIN
        // must match QFile::decodeName
        QString normalized = name.toString().normalized(QString::NormalizationForm_C);
        name = normalized;
#endif
        return QFileSystemEntry(dirPath + name, QFileSystemEntry::FromInternalPath());
    };
    if (!dir)
        return false;

    for (;;) {
        // From readdir man page:
        // If the end of the directory stream is reached, NULL is returned and errno is
        // not changed. If an error occurs, NULL is returned and errno is set to indicate
        // the error. To distinguish end of stream from an error, set errno to zero before
        // calling readdir() and then check the value of errno if NULL is returned.
        errno = 0;
        dirEntry = QT_READDIR(dir.get());

        if (dirEntry) {
            // POSIX allows readdir() to return a file name in struct dirent that
            // extends past the end of the d_name array (it's a char[1] array on QNX, for
            // example). Therefore, we *must* call strlen() on it to get the actual length
            // of the file name. See:
            // https://pubs.opengroup.org/onlinepubs/9699919799/basedefs/dirent.h.html#tag_13_07_05
            QByteArrayView name(dirEntry->d_name, strlen(dirEntry->d_name));
            // name.size() is sufficient here, see QUtf8::convertToUnicode() for details
            QVarLengthArray<char16_t> buffer(name.size());
            auto *end = toUtf16.appendToBuffer(buffer.data(), name);
            buffer.resize(end - buffer.constData());
            if (!toUtf16.hasError()) {
                fileEntry = asFileEntry(buffer);
                metaData.fillFromDirEnt(*dirEntry);
                return true;
            } else {
                errno = EILSEQ; // Invalid or incomplete multibyte or wide character
            }
        } else {
            break;
        }
    }

    lastError = errno;
    return false;
}